

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * createAggContext(sqlite3_context *p,int nByte)

{
  Mem *pMem_00;
  Mem *pMem;
  int nByte_local;
  sqlite3_context *p_local;
  
  pMem_00 = p->pMem;
  if (nByte < 1) {
    sqlite3VdbeMemSetNull(pMem_00);
    pMem_00->z = (char *)0x0;
  }
  else {
    sqlite3VdbeMemClearAndResize(pMem_00,nByte);
    pMem_00->flags = 0x2000;
    pMem_00->u = (MemValue)p->pFunc;
    if (pMem_00->z != (char *)0x0) {
      memset(pMem_00->z,0,(long)nByte);
    }
  }
  return pMem_00->z;
}

Assistant:

static SQLITE_NOINLINE void *createAggContext(sqlite3_context *p, int nByte){
  Mem *pMem = p->pMem;
  assert( (pMem->flags & MEM_Agg)==0 );
  if( nByte<=0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
  }else{
    sqlite3VdbeMemClearAndResize(pMem, nByte);
    pMem->flags = MEM_Agg;
    pMem->u.pDef = p->pFunc;
    if( pMem->z ){
      memset(pMem->z, 0, nByte);
    }
  }
  return (void*)pMem->z;
}